

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tables.cpp
# Opt level: O3

void __thiscall MT32Emu::Tables::Tables(Tables *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  Bit8u BVar10;
  int iVar11;
  int lf;
  long lVar12;
  float fVar13;
  int iVar14;
  double dVar15;
  int iVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  DACInputMode DVar21;
  DACInputMode DVar22;
  DACInputMode DVar23;
  DACInputMode DVar24;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar42;
  int iVar43;
  long lVar26;
  
  lVar12 = 0;
  do {
    dVar15 = log10((double)((float)(int)lVar12 + 1.0));
    iVar11 = (int)((2.0 - (float)dVar15) * 128.0 + 1.0);
    BVar10 = (Bit8u)iVar11;
    if (0xfe < iVar11) {
      BVar10 = 0xff;
    }
    this->levelToAmpSubtraction[lVar12] = BVar10;
    lVar12 = lVar12 + 1;
  } while (lVar12 != 0x65);
  this->envLogarithmicTime[0] = '@';
  lVar12 = 0;
  do {
    lVar26 = lVar12 + 1;
    dVar15 = log((double)(int)lVar26);
    fVar13 = ceilf((float)(dVar15 / 0.6931471824645996) * 8.0 + 64.0);
    this->envLogarithmicTime[lVar12 + 1] = (Bit8u)(int)fVar13;
    lVar12 = lVar26;
  } while (lVar26 != 0xff);
  this->masterVolToAmpSubtraction[0] = 0xff;
  lVar12 = 0;
  do {
    lVar26 = lVar12 + 1;
    dVar15 = log((double)(int)lVar26);
    this->masterVolToAmpSubtraction[lVar12 + 1] =
         (Bit8u)(int)((float)(dVar15 / -0.6931471824645996) * 16.0 + 106.31);
    auVar9 = _DAT_00126790;
    lVar12 = lVar26;
  } while (lVar26 != 100);
  iVar11 = 4;
  iVar41 = 5;
  iVar42 = 6;
  iVar43 = 7;
  DVar21 = DACInputMode_NICE;
  DVar22 = DACInputMode_PURE;
  DVar23 = DACInputMode_GENERATION1;
  DVar24 = DACInputMode_GENERATION2;
  lVar12 = 0;
  auVar25 = _DAT_00127f50;
  auVar27 = _DAT_00127f60;
  auVar28 = _DAT_00127f70;
  auVar29 = _DAT_00127f80;
  do {
    auVar16 = auVar29 ^ auVar9;
    auVar36._0_4_ = -(uint)(auVar16._0_4_ < -0x7fffff9b);
    auVar36._4_4_ = -(uint)(auVar16._0_4_ < -0x7fffff9b);
    auVar36._8_4_ = -(uint)(auVar16._8_4_ < -0x7fffff9b);
    auVar36._12_4_ = -(uint)(auVar16._8_4_ < -0x7fffff9b);
    auVar37._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar37._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar37._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar37._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar37 = auVar37 & auVar36;
    auVar16._0_4_ =
         ((float)((uint)(iVar11 * 0xff) >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(iVar11 * 0xff & 0xffffU | 0x4b000000);
    auVar16._4_4_ =
         ((float)((uint)(iVar41 * 0xff) >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(iVar41 * 0xff & 0xffffU | 0x4b000000);
    auVar16._8_4_ =
         ((float)((uint)(iVar42 * 0xff) >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(iVar42 * 0xff & 0xffffU | 0x4b000000);
    auVar16._12_4_ =
         ((float)((uint)(iVar43 * 0xff) >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(iVar43 * 0xff & 0xffffU | 0x4b000000);
    auVar33._0_4_ =
         ((float)(DVar21 * 0xff >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(DVar21 * 0xff & 0xffff | 0x4b000000);
    auVar33._4_4_ =
         ((float)(DVar22 * 0xff >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(DVar22 * 0xff & 0xffff | 0x4b000000);
    auVar33._8_4_ =
         ((float)(DVar23 * 0xff >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(DVar23 * 0xff & 0xffff | 0x4b000000);
    auVar33._12_4_ =
         ((float)(DVar24 * 0xff >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(DVar24 * 0xff & 0xffff | 0x4b000000);
    auVar34 = divps(auVar33,_DAT_00127fe0);
    auVar16 = divps(auVar16,_DAT_00127fe0);
    auVar35._0_4_ = (int)(auVar34._0_4_ + 0.5);
    auVar35._4_4_ = (int)(auVar34._4_4_ + 0.5);
    auVar35._8_4_ = (int)(auVar34._8_4_ + 0.5);
    auVar35._12_4_ = (int)(auVar34._12_4_ + 0.5);
    auVar34._0_4_ = (int)(auVar16._0_4_ + 0.5);
    auVar34._4_4_ = (int)(auVar16._4_4_ + 0.5);
    auVar34._8_4_ = (int)(auVar16._8_4_ + 0.5);
    auVar34._12_4_ = (int)(auVar16._12_4_ + 0.5);
    auVar36 = packssdw(auVar35,auVar34);
    auVar16 = pshuflw(auVar34,auVar37,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    sVar1 = auVar36._0_2_;
    sVar2 = auVar36._2_2_;
    sVar3 = auVar36._4_2_;
    sVar4 = auVar36._6_2_;
    sVar5 = auVar36._8_2_;
    sVar6 = auVar36._10_2_;
    sVar7 = auVar36._12_2_;
    sVar8 = auVar36._14_2_;
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->pulseWidth100To255[lVar12] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[0] - (0xff < sVar1)
      ;
    }
    auVar16 = packssdw(auVar37,auVar37);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
      this->pulseWidth100To255[lVar12 + 1] =
           (0 < sVar2) * (sVar2 < 0x100) * auVar36[2] - (0xff < sVar2);
    }
    auVar16 = auVar28 ^ auVar9;
    iVar14 = auVar16._0_4_;
    iVar20 = auVar16._8_4_;
    auVar30._4_4_ = iVar14;
    auVar30._0_4_ = iVar14;
    auVar30._8_4_ = iVar20;
    auVar30._12_4_ = iVar20;
    auVar38._0_4_ = -(uint)(iVar14 < -0x7fffff9b);
    auVar38._4_4_ = -(uint)(iVar14 < -0x7fffff9b);
    auVar38._8_4_ = -(uint)(iVar20 < -0x7fffff9b);
    auVar38._12_4_ = -(uint)(iVar20 < -0x7fffff9b);
    auVar17._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar17._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar17 = auVar17 & auVar38;
    auVar16 = packssdw(auVar30,auVar17);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      this->pulseWidth100To255[lVar12 + 2] =
           (0 < sVar3) * (sVar3 < 0x100) * auVar36[4] - (0xff < sVar3);
    }
    auVar16 = pshufhw(auVar17,auVar17,0x84);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      this->pulseWidth100To255[lVar12 + 3] =
           (0 < sVar4) * (sVar4 < 0x100) * auVar36[6] - (0xff < sVar4);
    }
    auVar16 = auVar27 ^ auVar9;
    iVar14 = auVar16._0_4_;
    iVar20 = auVar16._8_4_;
    auVar31._4_4_ = iVar14;
    auVar31._0_4_ = iVar14;
    auVar31._8_4_ = iVar20;
    auVar31._12_4_ = iVar20;
    auVar39._0_4_ = -(uint)(iVar14 < -0x7fffff9b);
    auVar39._4_4_ = -(uint)(iVar14 < -0x7fffff9b);
    auVar39._8_4_ = -(uint)(iVar20 < -0x7fffff9b);
    auVar39._12_4_ = -(uint)(iVar20 < -0x7fffff9b);
    auVar18._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar18._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar18._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar18._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar18 = auVar18 & auVar39;
    auVar16 = pshuflw(auVar31,auVar18,0xe8);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      this->pulseWidth100To255[lVar12 + 4] =
           (0 < sVar5) * (sVar5 < 0x100) * auVar36[8] - (0xff < sVar5);
    }
    auVar16 = packssdw(auVar18,auVar18);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      this->pulseWidth100To255[lVar12 + 5] =
           (0 < sVar6) * (sVar6 < 0x100) * auVar36[10] - (0xff < sVar6);
    }
    auVar16 = auVar25 ^ auVar9;
    iVar14 = auVar16._0_4_;
    iVar20 = auVar16._8_4_;
    auVar32._4_4_ = iVar14;
    auVar32._0_4_ = iVar14;
    auVar32._8_4_ = iVar20;
    auVar32._12_4_ = iVar20;
    auVar40._0_4_ = -(uint)(iVar14 < -0x7fffff9b);
    auVar40._4_4_ = -(uint)(iVar14 < -0x7fffff9b);
    auVar40._8_4_ = -(uint)(iVar20 < -0x7fffff9b);
    auVar40._12_4_ = -(uint)(iVar20 < -0x7fffff9b);
    auVar19._0_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar19._4_4_ = -(uint)(auVar16._4_4_ == -0x80000000);
    auVar19._8_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar19._12_4_ = -(uint)(auVar16._12_4_ == -0x80000000);
    auVar19 = auVar19 & auVar40;
    auVar16 = packssdw(auVar32,auVar19);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      this->pulseWidth100To255[lVar12 + 6] =
           (0 < sVar7) * (sVar7 < 0x100) * auVar36[0xc] - (0xff < sVar7);
    }
    auVar16 = pshufhw(auVar19,auVar19,0x84);
    auVar16 = packssdw(auVar16,auVar16);
    if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      this->pulseWidth100To255[lVar12 + 7] =
           (0 < sVar8) * (sVar8 < 0x100) * auVar36[0xe] - (0xff < sVar8);
    }
    lVar12 = lVar12 + 8;
    lVar26 = auVar29._8_8_;
    auVar29._0_8_ = auVar29._0_8_ + 8;
    auVar29._8_8_ = lVar26 + 8;
    lVar26 = auVar28._8_8_;
    auVar28._0_8_ = auVar28._0_8_ + 8;
    auVar28._8_8_ = lVar26 + 8;
    lVar26 = auVar27._8_8_;
    auVar27._0_8_ = auVar27._0_8_ + 8;
    auVar27._8_8_ = lVar26 + 8;
    lVar26 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 8;
    auVar25._8_8_ = lVar26 + 8;
    DVar21 = DVar21 + 8;
    DVar22 = DVar22 + 8;
    DVar23 = DVar23 + 8;
    DVar24 = DVar24 + 8;
    iVar11 = iVar11 + 8;
    iVar41 = iVar41 + 8;
    iVar42 = iVar42 + 8;
    iVar43 = iVar43 + 8;
  } while (lVar12 != 0x68);
  iVar11 = -1;
  lVar12 = 0;
  do {
    dVar15 = exp((double)(((float)iVar11 * 0.001953125 + 13.0) * 0.6931472));
    this->exp9[lVar12] = (Bit16u)(int)(8191.5 - (float)dVar15);
    lVar12 = lVar12 + 1;
    iVar11 = iVar11 + -1;
  } while (lVar12 != 0x200);
  lVar12 = 0;
  do {
    lVar26 = lVar12 + 1;
    dVar15 = sin((double)(((float)(int)lVar26 + 0.5) * 0.0009765625 * 3.1415927));
    dVar15 = log((double)(float)dVar15);
    this->logsin9[lVar12 + 1] = (Bit16u)(int)((float)(dVar15 / -0.6931471824645996) * 1024.0 + 0.5);
    lVar12 = lVar26;
  } while (lVar26 != 0x1ff);
  this->logsin9[0] = 0x1fff;
  this->resAmpDecayFactor = "\x1f\x10\f\b\x05\x03\x02\x01";
  return;
}

Assistant:

Tables::Tables() {
	for (int lf = 0; lf <= 100; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		float fVal = (2.0f - LOG10F(float(lf) + 1.0f)) * 128.0f;
		int val = int(fVal + 1.0);
		if (val > 255) {
			val = 255;
		}
		levelToAmpSubtraction[lf] = Bit8u(val);
	}

	envLogarithmicTime[0] = 64;
	for (int lf = 1; lf <= 255; lf++) {
		// CONFIRMED:KG: This matches a ROM table found by Mok
		envLogarithmicTime[lf] = Bit8u(ceil(64.0f + LOG2F(float(lf)) * 8.0f));
	}

#if 0
	// The table below is to be used in conjunction with emulation of VCA of newer generation units which is currently missing.
	// These relatively small values are rather intended to fine-tune the overall amplification of the VCA.
	// CONFIRMED: Based on a table found by Mok in the LAPC-I control ROM
	// Note that this matches the MT-32 table, but with the values clamped to a maximum of 8.
	memset(masterVolToAmpSubtraction, 8, 71);
	memset(masterVolToAmpSubtraction + 71, 7, 3);
	memset(masterVolToAmpSubtraction + 74, 6, 4);
	memset(masterVolToAmpSubtraction + 78, 5, 3);
	memset(masterVolToAmpSubtraction + 81, 4, 4);
	memset(masterVolToAmpSubtraction + 85, 3, 3);
	memset(masterVolToAmpSubtraction + 88, 2, 4);
	memset(masterVolToAmpSubtraction + 92, 1, 4);
	memset(masterVolToAmpSubtraction + 96, 0, 5);
#else
	// CONFIRMED: Based on a table found by Mok in the MT-32 control ROM
	masterVolToAmpSubtraction[0] = 255;
	for (int masterVol = 1; masterVol <= 100; masterVol++) {
		masterVolToAmpSubtraction[masterVol] = Bit8u(106.31 - 16.0f * LOG2F(float(masterVol)));
	}
#endif

	for (int i = 0; i <= 100; i++) {
		pulseWidth100To255[i] = Bit8u(i * 255 / 100.0f + 0.5f);
		//synth->printDebug("%d: %d", i, pulseWidth100To255[i]);
	}

	// The LA32 chip contains an exponent table inside. The table contains 12-bit integer values.
	// The actual table size is 512 rows. The 9 higher bits of the fractional part of the argument are used as a lookup address.
	// To improve the precision of computations, the lower bits are supposed to be used for interpolation as the LA32 chip also
	// contains another 512-row table with inverted differences between the main table values.
	for (int i = 0; i < 512; i++) {
		exp9[i] = Bit16u(8191.5f - EXP2F(13.0f + ~i / 512.0f));
	}

	// There is a logarithmic sine table inside the LA32 chip. The table contains 13-bit integer values.
	for (int i = 1; i < 512; i++) {
		logsin9[i] = Bit16u(0.5f - LOG2F(sin((i + 0.5f) / 1024.0f * FLOAT_PI)) * 1024.0f);
	}

	// The very first value is clamped to the maximum possible 13-bit integer
	logsin9[0] = 8191;

	// found from sample analysis
	static const Bit8u resAmpDecayFactorTable[] = {31, 16, 12, 8, 5, 3, 2, 1};
	resAmpDecayFactor = resAmpDecayFactorTable;
}